

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O2

bool __thiscall slang::driver::Driver::processOptions(Driver *this)

{
  Options *this_00;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *__lhs;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *poVar1
  ;
  DiagnosticEngine *this_01;
  char c;
  pointer pbVar2;
  size_t sVar3;
  char *pcVar4;
  JsonWriter *this_02;
  TextDiagnosticClient *this_03;
  bool bVar5;
  pointer pbVar6;
  pointer __p;
  __optional_eq_t<std::__cxx11::basic_string<char>,_char[10]> _Var7;
  __optional_eq_t<std::__cxx11::basic_string<char>,_char[7]> _Var8;
  __optional_eq_t<std::__cxx11::basic_string<char>,_char[4]> _Var9;
  __optional_ne_t<std::__cxx11::basic_string<char>,_char[4]> _Var10;
  __optional_ne_t<std::__cxx11::basic_string<char>,_char[7]> _Var11;
  __optional_ne_t<std::__cxx11::basic_string<char>,_char[6]> _Var12;
  __optional_ne_t<std::__cxx11::basic_string<char>,_char[5]> _Var13;
  bool bVar14;
  bool bVar15;
  __optional_eq_t<std::__cxx11::basic_string<char>,_char[6]> _Var16;
  _Storage<unsigned_int,_true> _Var17;
  optional<slang::TimeScale> oVar18;
  mapped_type *pmVar19;
  pointer pbVar20;
  pointer pbVar21;
  char *in_RDX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *extraout_RDX_11;
  LanguageVersion LVar22;
  Diagnostic *diag;
  long lVar23;
  size_t sVar24;
  Diagnostic *diagnostic;
  bool show;
  DiagnosticSeverity severity;
  DiagCode code;
  Diagnostic *ctx;
  pointer *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  ShowHierarchyPathOption SVar25;
  bool bVar26;
  string_view str;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view str_00;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_18446744073709551615UL>
  options;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  parts;
  iterator __end4;
  Diagnostics optionDiags;
  pointer local_48;
  size_type sStack_40;
  
  if ((this->options).colorDiags.super__Optional_base<bool,_true,_true>._M_payload.
      super__Optional_payload_base<bool>._M_engaged == true) {
    if ((this->options).colorDiags.super__Optional_base<bool,_true,_true>._M_payload.
        super__Optional_payload_base<bool>._M_payload._M_value == false) goto LAB_00533249;
LAB_00533260:
    OS::showColorsStderr = true;
    bVar14 = OS::fileSupportsColors(_stdout);
    show = true;
    in_RDX = extraout_RDX_00;
    if (bVar14) {
      OS::showColorsStdout = true;
    }
  }
  else {
    bVar14 = OS::fileSupportsColors(_stderr);
    in_RDX = extraout_RDX;
    if (bVar14) goto LAB_00533260;
LAB_00533249:
    show = false;
  }
  this_00 = &this->options;
  if ((this->options).languageVersion.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    _Var7 = std::operator==(&this_00->languageVersion,(char (*) [10])0x890b5c);
    LVar22 = Default;
    in_RDX = extraout_RDX_01;
    if (!_Var7) {
      _Var7 = std::operator==(&this_00->languageVersion,(char (*) [10])0x890b29);
      LVar22 = v1800_2023;
      in_RDX = extraout_RDX_02;
      if ((!_Var7) &&
         (_Var8 = std::operator==(&this_00->languageVersion,(char (*) [7])"latest"),
         in_RDX = extraout_RDX_03, !_Var8)) {
        parts.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             *(pointer *)
              &(this->options).languageVersion.
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_payload._M_value._M_dataplus;
        parts.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             *(pointer *)
              ((long)&(this->options).languageVersion.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload + 8);
        fmt_04.size_ = 0xd;
        fmt_04.data_ = (char *)0x24;
        args_04.field_1.values_ = in_R9.values_;
        args_04.desc_ = (unsigned_long_long)&parts;
        ::fmt::v11::vformat_abi_cxx11_
                  ((string *)&optionDiags,(v11 *)"invalid value for --std option: \'{}\'",fmt_04,
                   args_04);
        printError(this,(string *)&optionDiags);
        goto LAB_0053393c;
      }
    }
    this->languageVersion = LVar22;
  }
  __lhs = &(this->options).compat;
  if ((this->options).compat.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    _Var9 = std::operator==(__lhs,(char (*) [4])"vcs");
    if (!_Var9) {
      parts.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)(this->options).compat.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._M_value._M_dataplus._M_p;
      parts.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           *(pointer *)
            ((long)&(this->options).compat.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload + 8);
      fmt_03.size_ = 0xd;
      fmt_03.data_ = (char *)0x25;
      args_03.field_1.args_ = in_R9.args_;
      args_03.desc_ = (unsigned_long_long)&parts;
      ::fmt::v11::vformat_abi_cxx11_
                ((string *)&optionDiags,(v11 *)"invalid value for compat option: \'{}\'",fmt_03,
                 args_03);
      printError(this,(string *)&optionDiags);
      goto LAB_0053393c;
    }
    in_RDX = extraout_RDX_04;
    for (lVar23 = 0; lVar23 != 0x24; lVar23 = lVar23 + 4) {
      optionDiags.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>
      .data_ = (pointer)CONCAT44(optionDiags.super_SmallVector<slang::Diagnostic,_2UL>.
                                 super_SmallVectorBase<slang::Diagnostic>.data_._4_4_,
                                 *(undefined4 *)((long)&DAT_008e8180 + lVar23));
      pmVar19 = std::
                map<slang::ast::CompilationFlags,_std::optional<bool>,_std::less<slang::ast::CompilationFlags>,_std::allocator<std::pair<const_slang::ast::CompilationFlags,_std::optional<bool>_>_>_>
                ::at(&(this->options).compilationFlags,(key_type *)&optionDiags);
      if ((pmVar19->super__Optional_base<bool,_true,_true>)._M_payload.
          super__Optional_payload_base<bool>._M_engaged == false) {
        (pmVar19->super__Optional_base<bool,_true,_true>)._M_payload.
        super__Optional_payload_base<bool> = (_Optional_payload_base<bool>)0x101;
      }
      in_RDX = extraout_RDX_05;
    }
  }
  if ((this->options).minTypMax.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    poVar1 = &(this->options).minTypMax;
    _Var10 = std::operator!=(poVar1,(char (*) [4])0x8896ab);
    in_RDX = extraout_RDX_06;
    if (((_Var10) &&
        (_Var10 = std::operator!=(poVar1,(char (*) [4])"typ"), in_RDX = extraout_RDX_07, _Var10)) &&
       (_Var10 = std::operator!=(poVar1,(char (*) [4])0x8158b5), in_RDX = extraout_RDX_08, _Var10))
    {
      parts.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)(this->options).minTypMax.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._M_value._M_dataplus._M_p;
      parts.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           *(pointer *)
            ((long)&(this->options).minTypMax.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload + 8);
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x25;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)&parts;
      ::fmt::v11::vformat_abi_cxx11_
                ((string *)&optionDiags,(v11 *)"invalid value for timing option: \'{}\'",fmt,args);
      printError(this,(string *)&optionDiags);
      goto LAB_0053393c;
    }
  }
  poVar1 = &(this->options).diagHierarchy;
  if ((((this->options).diagHierarchy.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged == true) &&
      (_Var11 = std::operator!=(poVar1,(char (*) [7])0x8e9434), in_RDX = extraout_RDX_09, _Var11))
     && ((_Var12 = std::operator!=(poVar1,(char (*) [6])"never"), in_RDX = extraout_RDX_10, _Var12
         && (_Var13 = std::operator!=(poVar1,(char (*) [5])0x868c0f), in_RDX = extraout_RDX_11,
            _Var13)))) {
    parts.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)(this->options).diagHierarchy.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_payload._M_value._M_dataplus._M_p;
    parts.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         *(pointer *)
          ((long)&(this->options).diagHierarchy.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_payload + 8);
    fmt_00.size_ = 0xd;
    fmt_00.data_ = (char *)0x2d;
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)&parts;
    ::fmt::v11::vformat_abi_cxx11_
              ((string *)&optionDiags,(v11 *)"invalid value for diag-hierarchy option: \'{}\'",
               fmt_00,args_00);
    printError(this,(string *)&optionDiags);
LAB_0053393c:
    std::__cxx11::string::~string((string *)&optionDiags);
    return false;
  }
  if ((((this->options).librariesInheritMacros.super__Optional_base<bool,_true,_true>._M_payload.
        super__Optional_payload_base<bool>._M_engaged == true) &&
      ((this->options).librariesInheritMacros.super__Optional_base<bool,_true,_true>._M_payload.
       super__Optional_payload_base<bool>._M_payload._M_value != false)) &&
     (((this->options).singleUnit.super__Optional_base<bool,_true,_true>._M_payload.
       super__Optional_payload_base<bool>._M_engaged != true ||
      (((this->options).singleUnit.super__Optional_base<bool,_true,_true>._M_payload.
        super__Optional_payload_base<bool>._M_payload._M_value & 1U) == 0)))) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&optionDiags,
               "--single-unit must be set when --libraries-inherit-macros is used",
               (allocator<char> *)&parts);
    printError(this,(string *)&optionDiags);
    goto LAB_0053393c;
  }
  if (((this->options).timeScale.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_engaged == true) &&
     (str._M_str = in_RDX,
     str._M_len = (size_t)(this->options).timeScale.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._M_value._M_dataplus._M_p,
     oVar18 = TimeScale::fromString
                        (*(TimeScale **)
                          ((long)&(this->options).timeScale.
                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ._M_payload + 8),str),
     ((uint5)oVar18.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
             super__Optional_payload_base<slang::TimeScale> & 0x100000000) == 0)) {
    parts.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)(this->options).timeScale.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_payload._M_value._M_dataplus._M_p;
    parts.
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         *(pointer *)
          ((long)&(this->options).timeScale.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_payload + 8);
    fmt_01.size_ = 0xd;
    fmt_01.data_ = (char *)0x29;
    args_01.field_1.args_ = in_R9.args_;
    args_01.desc_ = (unsigned_long_long)&parts;
    ::fmt::v11::vformat_abi_cxx11_
              ((string *)&optionDiags,(v11 *)"invalid value for time scale option: \'{}\'",fmt_01,
               args_01);
    printError(this,(string *)&optionDiags);
    goto LAB_0053393c;
  }
  bVar14 = Options::lintMode(this_00);
  if (bVar14) {
    optionDiags.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.
    data_ = (pointer)CONCAT44(optionDiags.super_SmallVector<slang::Diagnostic,_2UL>.
                              super_SmallVectorBase<slang::Diagnostic>.data_._4_4_,0x80);
    pmVar19 = std::
              map<slang::ast::CompilationFlags,_std::optional<bool>,_std::less<slang::ast::CompilationFlags>,_std::allocator<std::pair<const_slang::ast::CompilationFlags,_std::optional<bool>_>_>_>
              ::at(&(this->options).compilationFlags,(key_type *)&optionDiags);
    if ((pmVar19->super__Optional_base<bool,_true,_true>)._M_payload.
        super__Optional_payload_base<bool>._M_engaged == false) {
      (pmVar19->super__Optional_base<bool,_true,_true>)._M_payload.
      super__Optional_payload_base<bool> = (_Optional_payload_base<bool>)0x101;
    }
  }
  SVar25 = Always;
  pbVar20 = (this->options).translateOffOptions.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->options).translateOffOptions.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar20 != pbVar2) {
    bVar14 = false;
    for (; pbVar20 != pbVar2; pbVar20 = pbVar20 + 1) {
      str_00._M_str = (char *)0x2c;
      str_00._M_len = (size_t)(pbVar20->_M_dataplus)._M_p;
      splitString(&parts,(slang *)pbVar20->_M_string_length,str_00,(char)in_R8);
      pbVar6 = parts.
               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar26 = (long)parts.
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)parts.
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start != 0x30;
      for (pbVar21 = parts.
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar21 != pbVar6;
          pbVar21 = pbVar21 + 1) {
        sVar3 = pbVar21->_M_len;
        pcVar4 = pbVar21->_M_str;
        if (sVar3 == 0) {
          bVar26 = true;
        }
        for (sVar24 = 0; sVar3 != sVar24; sVar24 = sVar24 + 1) {
          c = pcVar4[sVar24];
          bVar15 = isAlphaNumeric(c);
          bVar5 = true;
          if (bVar15) {
            bVar5 = bVar26;
          }
          if (c == '_') {
            bVar5 = bVar26;
          }
          bVar26 = bVar5;
        }
      }
      if (bVar26) {
        local_48 = (pbVar20->_M_dataplus)._M_p;
        sStack_40 = pbVar20->_M_string_length;
        in_R8 = &local_48;
        fmt_02.size_ = 0xd;
        fmt_02.data_ = (char *)0x2d;
        args_02.field_1.args_ = in_R9.args_;
        args_02.desc_ = (unsigned_long_long)in_R8;
        ::fmt::v11::vformat_abi_cxx11_
                  ((string *)&optionDiags,(v11 *)"invalid format for translate-off-format: \'{}\'",
                   fmt_02,args_02);
        printError(this,(string *)&optionDiags);
        std::__cxx11::string::~string((string *)&optionDiags);
      }
      else {
        std::
        vector<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>>
        ::
        emplace_back<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                  ((vector<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>>
                    *)&this->translateOffFormats,
                   parts.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   parts.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1,
                   parts.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 2);
      }
      bVar14 = (bool)(bVar26 | bVar14);
      std::
      _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::~_Vector_base(&parts.
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     );
    }
    if (bVar14) {
      return false;
    }
  }
  bVar14 = reportLoadErrors(this);
  if (!bVar14) {
    return false;
  }
  if ((this->sourceLoader).fileEntries.
      super__Vector_base<slang::driver::SourceLoader::FileEntry,_std::allocator<slang::driver::SourceLoader::FileEntry>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->sourceLoader).fileEntries.
      super__Vector_base<slang::driver::SourceLoader::FileEntry,_std::allocator<slang::driver::SourceLoader::FileEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&optionDiags,"no input files",(allocator<char> *)&parts);
    printError(this,(string *)&optionDiags);
    goto LAB_0053393c;
  }
  if ((this->options).diagJson.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    std::make_unique<slang::JsonWriter>();
    __p = optionDiags.super_SmallVector<slang::Diagnostic,_2UL>.
          super_SmallVectorBase<slang::Diagnostic>.data_;
    optionDiags.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.
    data_ = (pointer)0x0;
    std::__uniq_ptr_impl<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_>::reset
              ((__uniq_ptr_impl<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_> *)
               &this->jsonWriter,(pointer)__p);
    std::unique_ptr<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_>::~unique_ptr
              ((unique_ptr<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_> *)
               &optionDiags);
    this_02 = (this->jsonWriter)._M_t.
              super___uniq_ptr_impl<slang::JsonWriter,_std::default_delete<slang::JsonWriter>_>._M_t
              .super__Tuple_impl<0UL,_slang::JsonWriter_*,_std::default_delete<slang::JsonWriter>_>.
              super__Head_base<0UL,_slang::JsonWriter_*,_false>._M_head_impl;
    this_02->pretty = true;
    JsonWriter::startArray(this_02);
    std::make_shared<slang::JsonDiagnosticClient,slang::JsonWriter&>((JsonWriter *)&optionDiags);
    std::__shared_ptr<slang::JsonDiagnosticClient,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->jsonDiagClient).
                super___shared_ptr<slang::JsonDiagnosticClient,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<slang::JsonDiagnosticClient,_(__gnu_cxx::_Lock_policy)2> *)&optionDiags
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &optionDiags.super_SmallVector<slang::Diagnostic,_2UL>.
                super_SmallVectorBase<slang::Diagnostic>.len);
    (((this->jsonDiagClient).
      super___shared_ptr<slang::JsonDiagnosticClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_DiagnosticClient).absPaths =
         (bool)((this->options).diagAbsPaths.super__Optional_base<bool,_true,_true>._M_payload.
                super__Optional_payload_base<bool>._M_engaged &
               (this->options).diagAbsPaths.super__Optional_base<bool,_true,_true>._M_payload.
               super__Optional_payload_base<bool>._M_payload._M_value);
    std::__shared_ptr<slang::DiagnosticClient,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<slang::JsonDiagnosticClient,void>
              ((__shared_ptr<slang::DiagnosticClient,(__gnu_cxx::_Lock_policy)2> *)&optionDiags,
               &(this->jsonDiagClient).
                super___shared_ptr<slang::JsonDiagnosticClient,_(__gnu_cxx::_Lock_policy)2>);
    DiagnosticEngine::addClient
              (&this->diagEngine,(shared_ptr<slang::DiagnosticClient> *)&optionDiags);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &optionDiags.super_SmallVector<slang::Diagnostic,_2UL>.
                super_SmallVectorBase<slang::Diagnostic>.len);
  }
  this_03 = (this->textDiagClient).
            super___shared_ptr<slang::TextDiagnosticClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  TextDiagnosticClient::showColors(this_03,show);
  bVar14 = (bool)((this->options).diagColumn.super__Optional_base<bool,_true,_true>._M_payload.
                  super__Optional_payload_base<bool>._M_payload._M_value & 1);
  if ((this->options).diagColumn.super__Optional_base<bool,_true,_true>._M_payload.
      super__Optional_payload_base<bool>._M_engaged == false) {
    bVar14 = true;
  }
  this_03->includeColumn = bVar14;
  bVar14 = (bool)((this->options).diagLocation.super__Optional_base<bool,_true,_true>._M_payload.
                  super__Optional_payload_base<bool>._M_payload._M_value & 1);
  if ((this->options).diagLocation.super__Optional_base<bool,_true,_true>._M_payload.
      super__Optional_payload_base<bool>._M_engaged == false) {
    bVar14 = true;
  }
  this_03->includeLocation = bVar14;
  bVar14 = (bool)((this->options).diagSourceLine.super__Optional_base<bool,_true,_true>._M_payload.
                  super__Optional_payload_base<bool>._M_payload._M_value & 1);
  if ((this->options).diagSourceLine.super__Optional_base<bool,_true,_true>._M_payload.
      super__Optional_payload_base<bool>._M_engaged == false) {
    bVar14 = true;
  }
  this_03->includeSource = bVar14;
  bVar14 = (bool)((this->options).diagOptionName.super__Optional_base<bool,_true,_true>._M_payload.
                  super__Optional_payload_base<bool>._M_payload._M_value & 1);
  if ((this->options).diagOptionName.super__Optional_base<bool,_true,_true>._M_payload.
      super__Optional_payload_base<bool>._M_engaged == false) {
    bVar14 = true;
  }
  this_03->includeOptionName = bVar14;
  bVar14 = (bool)((this->options).diagIncludeStack.super__Optional_base<bool,_true,_true>._M_payload
                  .super__Optional_payload_base<bool>._M_payload._M_value & 1);
  if ((this->options).diagIncludeStack.super__Optional_base<bool,_true,_true>._M_payload.
      super__Optional_payload_base<bool>._M_engaged == false) {
    bVar14 = true;
  }
  this_03->includeFileStack = bVar14;
  bVar14 = (bool)((this->options).diagMacroExpansion.super__Optional_base<bool,_true,_true>.
                  _M_payload.super__Optional_payload_base<bool>._M_payload._M_value & 1);
  if ((this->options).diagMacroExpansion.super__Optional_base<bool,_true,_true>._M_payload.
      super__Optional_payload_base<bool>._M_engaged == false) {
    bVar14 = true;
  }
  this_03->includeExpansion = bVar14;
  (this_03->super_DiagnosticClient).absPaths =
       (bool)((this->options).diagAbsPaths.super__Optional_base<bool,_true,_true>._M_payload.
              super__Optional_payload_base<bool>._M_engaged &
             (this->options).diagAbsPaths.super__Optional_base<bool,_true,_true>._M_payload.
             super__Optional_payload_base<bool>._M_payload._M_value);
  _Var8 = std::operator==(poVar1,(char (*) [7])0x8e9434);
  if (!_Var8) {
    _Var16 = std::operator==(poVar1,(char (*) [6])"never");
    if (!_Var16) goto LAB_00533896;
    SVar25 = Never;
  }
  this_03->includeHierarchy = SVar25;
LAB_00533896:
  this_01 = &this->diagEngine;
  if ((this->options).errorLimit.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_engaged == false) {
    _Var17._M_value = 0x14;
  }
  else {
    _Var17 = (this->options).errorLimit.super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>._M_payload;
  }
  (this->diagEngine).errorLimit = (int)_Var17;
  DiagnosticEngine::setDefaultWarnings(this_01);
  DiagnosticEngine::setSeverity(this_01,(DiagCode)0x40000a,Error);
  DiagnosticEngine::setSeverity(this_01,(DiagCode)0x550008,Error);
  DiagnosticEngine::setSeverity(this_01,(DiagCode)0x42000a,Error);
  _Var9 = std::operator==(__lhs,(char (*) [4])"vcs");
  if (_Var9) {
    DiagnosticEngine::setSeverity(this_01,(DiagCode)0xf90006,Ignored);
    DiagnosticEngine::setSeverity(this_01,(DiagCode)0xc30007,Ignored);
    DiagnosticEngine::setSeverity(this_01,(DiagCode)0x2b000b,Ignored);
    DiagnosticEngine::setSeverity(this_01,(DiagCode)0x30000b,Ignored);
    DiagnosticEngine::setSeverity(this_01,(DiagCode)0xc90005,Ignored);
    code.subsystem = Parser;
    code.code = 200;
    severity = Ignored;
  }
  else {
    severity = Error;
    DiagnosticEngine::setSeverity(this_01,(DiagCode)0xc40007,Error);
    DiagnosticEngine::setSeverity(this_01,(DiagCode)0xd00007,Error);
    DiagnosticEngine::setSeverity(this_01,(DiagCode)0xd10007,Error);
    DiagnosticEngine::setSeverity(this_01,(DiagCode)0xf00006,Error);
    DiagnosticEngine::setSeverity(this_01,(DiagCode)0xca0005,Error);
    DiagnosticEngine::setSeverity(this_01,(DiagCode)0xc30005,Error);
    code.subsystem = Expressions;
    code.code = 0xd6;
  }
  DiagnosticEngine::setSeverity(this_01,code,severity);
  pbVar20 = (this->options).warningOptions.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  options._M_extent._M_extent_value =
       (long)(this->options).warningOptions.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar20 >> 5;
  options._M_ptr = pbVar20;
  ctx = (Diagnostic *)this_01;
  DiagnosticEngine::setWarningOptions(&optionDiags,this_01,options);
  diagnostic = optionDiags.super_SmallVector<slang::Diagnostic,_2UL>.
               super_SmallVectorBase<slang::Diagnostic>.data_;
  for (lVar23 = optionDiags.super_SmallVector<slang::Diagnostic,_2UL>.
                super_SmallVectorBase<slang::Diagnostic>.len * 0x70; lVar23 != 0;
      lVar23 = lVar23 + -0x70) {
    ctx = diagnostic;
    DiagnosticEngine::issue(this_01,diagnostic);
    diagnostic = diagnostic + 1;
  }
  SmallVectorBase<slang::Diagnostic>::cleanup
            ((SmallVectorBase<slang::Diagnostic> *)&optionDiags,(EVP_PKEY_CTX *)ctx);
  return true;
}

Assistant:

bool Driver::processOptions() {
    bool showColors;
    if (options.colorDiags.has_value())
        showColors = *options.colorDiags;
    else
        showColors = OS::fileSupportsColors(stderr);

    if (showColors) {
        OS::setStderrColorsEnabled(true);
        if (OS::fileSupportsColors(stdout))
            OS::setStdoutColorsEnabled(true);
    }

    if (options.languageVersion.has_value()) {
        if (options.languageVersion == "1800-2017")
            languageVersion = LanguageVersion::v1800_2017;
        else if (options.languageVersion == "1800-2023" || options.languageVersion == "latest")
            languageVersion = LanguageVersion::v1800_2023;
        else {
            printError(
                fmt::format("invalid value for --std option: '{}'", *options.languageVersion));
            return false;
        }
    }

    if (options.compat.has_value()) {
        if (options.compat == "vcs") {
            auto vcsCompatFlags = {CompilationFlags::AllowHierarchicalConst,
                                   CompilationFlags::AllowUseBeforeDeclare,
                                   CompilationFlags::RelaxEnumConversions,
                                   CompilationFlags::RelaxStringConversions,
                                   CompilationFlags::AllowRecursiveImplicitCall,
                                   CompilationFlags::AllowBareValParamAssignment,
                                   CompilationFlags::AllowSelfDeterminedStreamConcat,
                                   CompilationFlags::AllowMultiDrivenLocals,
                                   CompilationFlags::AllowMergingAnsiPorts};

            for (auto flag : vcsCompatFlags) {
                auto& option = options.compilationFlags.at(flag);
                if (!option.has_value())
                    option = true;
            }
        }
        else {
            printError(fmt::format("invalid value for compat option: '{}'", *options.compat));
            return false;
        }
    }

    if (options.minTypMax.has_value() && options.minTypMax != "min" && options.minTypMax != "typ" &&
        options.minTypMax != "max") {
        printError(fmt::format("invalid value for timing option: '{}'", *options.minTypMax));
        return false;
    }

    if (options.diagHierarchy.has_value() && options.diagHierarchy != "always" &&
        options.diagHierarchy != "never" && options.diagHierarchy != "auto") {
        printError(
            fmt::format("invalid value for diag-hierarchy option: '{}'", *options.diagHierarchy));
        return false;
    }

    if (options.librariesInheritMacros == true && !options.singleUnit.value_or(false)) {
        printError("--single-unit must be set when --libraries-inherit-macros is used");
        return false;
    }

    if (options.timeScale.has_value() && !TimeScale::fromString(*options.timeScale)) {
        printError(fmt::format("invalid value for time scale option: '{}'", *options.timeScale));
        return false;
    }

    if (options.lintMode()) {
        auto& opt = options.compilationFlags.at(CompilationFlags::IgnoreUnknownModules);
        if (!opt.has_value())
            opt = true;
    }

    if (!options.translateOffOptions.empty()) {
        bool anyBad = false;
        for (auto& fmtStr : options.translateOffOptions) {
            bool bad = false;
            auto parts = splitString(fmtStr, ',');
            if (parts.size() != 3)
                bad = true;

            for (auto part : parts) {
                if (part.empty())
                    bad = true;

                for (char c : part) {
                    if (!isAlphaNumeric(c) && c != '_')
                        bad = true;
                }
            }

            if (bad)
                printError(fmt::format("invalid format for translate-off-format: '{}'", fmtStr));
            else
                translateOffFormats.emplace_back(parts[0], parts[1], parts[2]);

            anyBad |= bad;
        }

        if (anyBad)
            return false;
    }

    if (!reportLoadErrors())
        return false;

    if (!sourceLoader.hasFiles()) {
        printError("no input files");
        return false;
    }

    if (options.diagJson.has_value()) {
        jsonWriter = std::make_unique<JsonWriter>();
        jsonWriter->setPrettyPrint(true);
        jsonWriter->startArray();

        jsonDiagClient = std::make_shared<JsonDiagnosticClient>(*jsonWriter);
        jsonDiagClient->showAbsPaths(options.diagAbsPaths.value_or(false));
        diagEngine.addClient(jsonDiagClient);
    }

    auto& tdc = *textDiagClient;
    tdc.showColors(showColors);
    tdc.showColumn(options.diagColumn.value_or(true));
    tdc.showLocation(options.diagLocation.value_or(true));
    tdc.showSourceLine(options.diagSourceLine.value_or(true));
    tdc.showOptionName(options.diagOptionName.value_or(true));
    tdc.showIncludeStack(options.diagIncludeStack.value_or(true));
    tdc.showMacroExpansion(options.diagMacroExpansion.value_or(true));
    tdc.showAbsPaths(options.diagAbsPaths.value_or(false));

    if (options.diagHierarchy == "always")
        tdc.showHierarchyInstance(ShowHierarchyPathOption::Always);
    else if (options.diagHierarchy == "never")
        tdc.showHierarchyInstance(ShowHierarchyPathOption::Never);

    diagEngine.setErrorLimit((int)options.errorLimit.value_or(20));
    diagEngine.setDefaultWarnings();

    // Some tools violate the standard in various ways, but in order to allow
    // compatibility with these tools we change the respective errors into a
    // suppressible warning that we promote to an error by default. This allows
    // the user to turn this back into a warning, or turn it off altogether.

    diagEngine.setSeverity(diag::DuplicateDefinition, DiagnosticSeverity::Error);
    diagEngine.setSeverity(diag::BadProceduralForce, DiagnosticSeverity::Error);
    diagEngine.setSeverity(diag::UnknownSystemName, DiagnosticSeverity::Error);

    if (options.compat == "vcs") {
        diagEngine.setSeverity(diag::StaticInitializerMustBeExplicit, DiagnosticSeverity::Ignored);
        diagEngine.setSeverity(diag::ImplicitConvert, DiagnosticSeverity::Ignored);
        diagEngine.setSeverity(diag::BadFinishNum, DiagnosticSeverity::Ignored);
        diagEngine.setSeverity(diag::NonstandardSysFunc, DiagnosticSeverity::Ignored);
        diagEngine.setSeverity(diag::NonstandardForeach, DiagnosticSeverity::Ignored);
        diagEngine.setSeverity(diag::NonstandardDist, DiagnosticSeverity::Ignored);
    }
    else {
        // These warnings are set to Error severity by default, unless we're in vcs compat mode.
        // The user can always downgrade via warning options, which get set after this.
        diagEngine.setSeverity(diag::IndexOOB, DiagnosticSeverity::Error);
        diagEngine.setSeverity(diag::RangeOOB, DiagnosticSeverity::Error);
        diagEngine.setSeverity(diag::RangeWidthOOB, DiagnosticSeverity::Error);
        diagEngine.setSeverity(diag::ImplicitNamedPortTypeMismatch, DiagnosticSeverity::Error);
        diagEngine.setSeverity(diag::SplitDistWeightOp, DiagnosticSeverity::Error);
        diagEngine.setSeverity(diag::DPIPureTask, DiagnosticSeverity::Error);
        diagEngine.setSeverity(diag::SpecifyPathConditionExpr, DiagnosticSeverity::Error);
    }

    Diagnostics optionDiags = diagEngine.setWarningOptions(options.warningOptions);
    for (auto& diag : optionDiags)
        diagEngine.issue(diag);

    return true;
}